

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# val_VecStr.cpp
# Opt level: O1

shared_ptr<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
 __thiscall mbc::Val::VecStr::json_value(VecStr *this)

{
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_00;
  undefined8 allocator;
  SizeType SVar1;
  int *piVar2;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_01;
  Data *__dest;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Number *pNVar3;
  long in_RSI;
  shared_ptr<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
  sVar4;
  Data local_58;
  Data local_48;
  
  (this->super__ValAtom).super_ValBase._vptr_ValBase = (_func_int **)0x0;
  piVar2 = (int *)operator_new(0x20);
  piVar2[2] = 1;
  piVar2[3] = 1;
  *(undefined ***)piVar2 = &PTR___Sp_counted_ptr_inplace_00140768;
  this_00 = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)(piVar2 + 4);
  piVar2[4] = 0;
  piVar2[5] = 0;
  piVar2[6] = 0;
  piVar2[7] = 0;
  (this->super__ValAtom).super_ValBase.count_ = piVar2;
  (this->super__ValAtom).super_ValBase._vptr_ValBase = (_func_int **)this_00;
  allocator = ValBase::doc_._16_8_;
  if (ValBase::doc_._16_8_ == 0) {
    __assert_fail("allocator_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/PeterlitsZo[P]MessageBookCli/src/val/../../include/rapidjson/document.h"
                  ,0x9bc,
                  "Allocator &rapidjson::GenericDocument<rapidjson::UTF8<>>::GetAllocator() [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>, StackAllocator = rapidjson::CrtAllocator]"
                 );
  }
  (this_00->data_).n = (Number)0x0;
  piVar2[6] = 0;
  piVar2[7] = 0;
  *(undefined2 *)((long)piVar2 + 0x1e) = 3;
  local_48.s.str = (Ch *)0x40500000012c0be;
  local_48.n = (Number)0x5;
  local_58.n = (Number)0x0;
  local_58.s.str = (Ch *)((ulong)(ushort)(**(byte **)(in_RSI + 0x18) + 9) << 0x30);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(this_00,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_48.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_58.s,(MemoryPoolAllocator<rapidjson::CrtAllocator> *)allocator);
  this_01 = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)operator_new(0x10);
  (this_01->data_).n = (Number)0x0;
  (this_01->data_).s.str = (Ch *)0x0;
  (this_01->data_).f.flags = 4;
  pNVar3 = (Number *)**(long **)(in_RSI + 0x30);
  if (pNVar3 != (Number *)(*(long **)(in_RSI + 0x30))[1]) {
    do {
      local_58.n = *pNVar3;
      local_48.n.i64 = (Number)0x0;
      local_48.s.str = (Ch *)0x0;
      SVar1 = rapidjson::GenericStringRef<char>::NotNullStrLen
                        ((GenericStringRef<char> *)&local_58.s,(char *)local_58.n);
      local_58._8_4_ = SVar1;
      if (SVar1 < 0xe) {
        local_48.ss.str[0xd] = '\r' - (char)SVar1;
        local_48.f.flags = 0x1c05;
        __dest = &local_48;
      }
      else {
        local_48.f.flags = 0xc05;
        local_48.s.length = SVar1;
        __dest = (Data *)rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>::Malloc
                                   ((MemoryPoolAllocator<rapidjson::CrtAllocator> *)allocator,
                                    (ulong)(SVar1 + 1));
        local_48.s.str = (Ch *)((ulong)local_48.s.str & 0xffff000000000000 | (ulong)__dest);
      }
      memcpy(__dest,(void *)local_58.n,(ulong)local_58.s.str & 0xffffffff);
      *(undefined1 *)((long)__dest + ((ulong)local_58.s.str & 0xffffffff)) = 0;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::PushBack(this_01,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          *)&local_48.s,(MemoryPoolAllocator<rapidjson::CrtAllocator> *)allocator);
      pNVar3 = pNVar3 + 4;
    } while (pNVar3 != *(Number **)(*(long *)(in_RSI + 0x30) + 8));
  }
  local_58.s.str = (Ch *)0x40500000012df35;
  local_58.n = (Number)0x5;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(this_00,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_58.s,this_01,(MemoryPoolAllocator<rapidjson::CrtAllocator> *)allocator
           );
  operator_delete(this_01);
  sVar4.
  super___shared_ptr<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  sVar4.
  super___shared_ptr<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (shared_ptr<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
          )sVar4.
           super___shared_ptr<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

shared_ptr<Value> VecStr::json_value() {
    shared_ptr<Value> v = std::make_shared<Value>();
    auto& allo = doc_.GetAllocator();

    v -> SetObject();
    v -> AddMember("valid", *is_vaild_, allo);

    auto vv = new Value();
    vv -> SetArray();
    for (auto it = value_->begin(); it != value_->end(); ++it) {
        vv -> PushBack(Value(it->c_str(), allo).Move(), allo);
    }
    v -> AddMember("value", *vv, allo);
    delete vv;

    return v;
}